

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O1

void Bmc_GiaGenerateJust(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvValues,Vec_Bit_t **pvJustis)

{
  size_t __n;
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Bit_t *vValues;
  int *piVar8;
  Vec_Bit_t *vJustis;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  Gia_Obj_t *pGVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  
  uVar6 = (pCex->iFrame + 1) * p->nObjs;
  iVar13 = (((int)uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
  vValues = (Vec_Bit_t *)malloc(0x10);
  vValues->nSize = 0;
  iVar20 = iVar13 * 0x20;
  vValues->nCap = iVar20;
  if (iVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar13 * 4);
  }
  vValues->pArray = piVar8;
  vValues->nSize = iVar20;
  __n = (long)iVar13 * 4;
  memset(piVar8,0,__n);
  vJustis = (Vec_Bit_t *)malloc(0x10);
  vJustis->nSize = 0;
  vJustis->nCap = iVar20;
  if (iVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc(__n);
  }
  vJustis->pArray = piVar8;
  vJustis->nSize = iVar20;
  memset(piVar8,0,__n);
  Gia_ManCleanMark0(p);
  Gia_ManCleanMark1(p);
  iVar13 = p->nRegs;
  uVar6 = 0;
  if (0 < iVar13) {
    uVar16 = 0;
    do {
      iVar20 = p->vCos->nSize;
      uVar6 = (iVar20 - iVar13) + uVar16;
      if (((int)uVar6 < 0) || (iVar20 <= (int)uVar6)) goto LAB_005746fb;
      iVar13 = p->vCos->pArray[uVar6];
      lVar17 = (long)iVar13;
      if ((lVar17 < 0) || (p->nObjs <= iVar13)) goto LAB_005746bd;
      pGVar2 = p->pObjs;
      uVar6 = uVar16;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar6 = uVar16 + 1;
      *(ulong *)(pGVar2 + lVar17) =
           *(ulong *)(pGVar2 + lVar17) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar16 >> 5] >> ((byte)uVar16 & 0x1f) & 1) << 0x1e);
      iVar13 = p->nRegs;
      uVar16 = uVar6;
    } while ((int)uVar6 < iVar13);
  }
  if (-1 < pCex->iFrame) {
    iVar20 = 0;
    iVar13 = 0;
    do {
      uVar16 = p->nObjs;
      uVar10 = (ulong)uVar16;
      if (0 < (int)uVar16) {
        lVar21 = 0;
        lVar17 = 0;
        do {
          uVar16 = (uint)uVar10;
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar10 = *(ulong *)(&pGVar2->field_0x0 + lVar21);
          uVar7 = (uint)uVar10;
          iVar15 = (int)(uVar10 & 0x1fffffff);
          uVar5 = (uint)(uVar10 >> 0x20);
          if ((uVar10 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
            if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
              if ((int)(uVar5 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
                uVar10 = uVar10 & 0xbfffffffbfffffff | 0x4000000000000000 |
                         (ulong)(((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> ((byte)uVar6 & 0x1f) & 1)
                                << 0x1e);
                uVar6 = uVar6 + 1;
              }
              else {
                iVar15 = p->vCis->nSize;
                if ((int)(uVar5 & 0x1fffffff) < iVar15 - p->nRegs) {
LAB_005746dc:
                  __assert_fail("Gia_ObjIsRo(p, pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                }
                iVar1 = p->vCos->nSize;
                uVar7 = (iVar1 - iVar15) + (uVar5 & 0x1fffffff);
                if (((int)uVar7 < 0) || (iVar1 <= (int)uVar7)) goto LAB_005746fb;
                iVar15 = p->vCos->pArray[uVar7];
                if (((long)iVar15 < 0) || ((int)uVar16 <= iVar15)) goto LAB_005746bd;
                uVar9 = (ulong)((uint)*(undefined8 *)(pGVar2 + iVar15) & 0x40000000);
                *(ulong *)(&pGVar2->field_0x0 + lVar21) = uVar10 & 0xffffffffbfffffff | uVar9;
                iVar15 = p->vCis->nSize;
                if ((int)(uVar5 & 0x1fffffff) < iVar15 - p->nRegs) goto LAB_005746dc;
                iVar1 = p->vCos->nSize;
                uVar16 = (iVar1 - iVar15) + (uVar5 & 0x1fffffff);
                if (((int)uVar16 < 0) || (iVar1 <= (int)uVar16)) goto LAB_005746fb;
                iVar15 = p->vCos->pArray[uVar16];
                if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_005746bd;
                uVar10 = uVar10 & 0xbfffffffbfffffff | uVar9 |
                         *(ulong *)(p->pObjs + iVar15) & 0x4000000000000000;
              }
            }
            else if ((int)uVar7 < 0 && iVar15 != 0x1fffffff) {
              uVar9 = (ulong)((uVar7 * 2 ^
                              *(uint *)((long)pGVar2 + (ulong)(uint)(iVar15 << 2) * -3 + lVar21)) &
                             0x40000000);
              *(ulong *)(&pGVar2->field_0x0 + lVar21) = uVar10 & 0xffffffffbfffffff | uVar9;
              uVar10 = uVar10 & 0xbfffffffbfffffff | uVar9 |
                       *(ulong *)((long)pGVar2 + (ulong)((uVar7 & 0x1fffffff) << 2) * -3 + lVar21) &
                       0x4000000000000000;
            }
            else {
              if ((~uVar10 & 0x1fffffff1fffffff) != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                              ,0x9e,
                              "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                             );
              }
              uVar10 = uVar10 | 0x4000000000000000;
            }
          }
          else {
            uVar9 = *(ulong *)((long)pGVar2 + (ulong)(uint)(iVar15 << 2) * -3 + lVar21);
            uVar11 = (uint)(uVar10 >> 0x1d) & 7 ^ (uint)(uVar9 >> 0x1e) & 3;
            uVar3 = *(ulong *)((long)pGVar2 +
                              (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3 + lVar21);
            uVar7 = (uint)(uVar3 >> 0x1e) & 1;
            uVar19 = uVar5 >> 0x1d & 1;
            uVar14 = (uVar7 ^ uVar19) & uVar11;
            uVar18 = (ulong)(uVar14 << 0x1e);
            *(ulong *)(&pGVar2->field_0x0 + lVar21) = uVar10 & 0xffffffff3fffffff | uVar18;
            uVar16 = (uint)(uVar9 >> 0x20);
            uVar5 = (uint)(uVar3 >> 0x20);
            if (uVar14 == 0) {
              if (((uVar11 & 1) == 0) && (uVar7 == uVar19)) {
                uVar10 = uVar10 & 0xbfffffff3fffffff |
                         ((ulong)((uVar5 | uVar16) >> 0x1e) & 1) << 0x3e;
              }
              else if ((uVar11 & 1) == 0) {
                uVar10 = uVar10 & 0xbfffffff3fffffff | uVar9 & 0x4000000000000000;
              }
              else {
                if (uVar7 != uVar19) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                                ,0x88,
                                "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                               );
                }
                uVar10 = uVar10 & 0xbfffffff3fffffff | uVar3 & 0x4000000000000000;
              }
            }
            else {
              uVar10 = uVar10 & 0xbfffffff3fffffff | uVar18 |
                       (ulong)((uVar5 & uVar16) >> 0x1e & 1) << 0x3e;
            }
          }
          *(ulong *)(&pGVar2->field_0x0 + lVar21) = uVar10;
          if (((uint)uVar10 >> 0x1e & 1) != 0) {
            uVar10 = iVar20 + lVar17;
            if (((long)uVar10 < 0) || ((long)vValues->nSize <= (long)uVar10)) goto LAB_0057469e;
            vValues->pArray[uVar10 >> 5 & 0x7ffffff] =
                 vValues->pArray[uVar10 >> 5 & 0x7ffffff] |
                 1 << ((char)iVar20 + (char)lVar17 & 0x1fU);
          }
          if ((*(ulong *)(&pGVar2->field_0x0 + lVar21) & 0x4000000000000000) != 0) {
            uVar10 = iVar20 + lVar17;
            if (((long)uVar10 < 0) || ((long)vJustis->nSize <= (long)uVar10)) {
LAB_0057469e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
            }
            vJustis->pArray[uVar10 >> 5 & 0x7ffffff] =
                 vJustis->pArray[uVar10 >> 5 & 0x7ffffff] |
                 1 << ((char)iVar20 + (char)lVar17 & 0x1fU);
          }
          lVar17 = lVar17 + 1;
          uVar16 = p->nObjs;
          uVar10 = (ulong)(int)uVar16;
          lVar21 = lVar21 + 0xc;
        } while (lVar17 < (long)uVar10);
      }
      iVar20 = uVar16 + iVar20;
      bVar4 = iVar13 < pCex->iFrame;
      iVar13 = iVar13 + 1;
    } while (bVar4);
  }
  if (uVar6 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0xa5,
                  "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)");
  }
  Gia_ManCleanMark0(p);
  Gia_ManCleanMark1(p);
  uVar6 = pCex->iPo;
  iVar13 = p->vCos->nSize;
  if (iVar13 - p->nRegs <= (int)uVar6) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar6) && ((int)uVar6 < iVar13)) {
    iVar13 = p->vCos->pArray[uVar6];
    if ((-1 < (long)iVar13) && (iVar13 < p->nObjs)) {
      uVar6 = p->nObjs * pCex->iFrame + iVar13;
      if ((-1 < (int)uVar6) && ((int)uVar6 < vJustis->nSize)) {
        uVar16 = vJustis->pArray[uVar6 >> 5];
        if ((uVar16 >> (uVar6 & 0x1f) & 1) != 0) {
          __assert_fail("Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                        ,0xaa,
                        "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                       );
        }
        pGVar12 = p->pObjs + iVar13;
        vJustis->pArray[uVar6 >> 5] = uVar16 | 1 << (uVar6 & 0x1f);
        Bmc_GiaGenerateJustNonRec(p,pCex->iFrame,vValues,vJustis);
        pGVar2 = p->pObjs;
        if ((pGVar12 < pGVar2) || (pGVar2 + p->nObjs <= pGVar12)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar6 = (int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555 +
                p->nObjs * pCex->iFrame;
        if ((-1 < (int)uVar6) && ((int)uVar6 < vJustis->nSize)) {
          if (((uint)vJustis->pArray[uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
            *pvValues = vValues;
            *pvJustis = vJustis;
            return;
          }
          __assert_fail("Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 1"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                        ,0xae,
                        "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                       );
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
    }
LAB_005746bd:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_005746fb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Bmc_GiaGenerateJust( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvValues, Vec_Bit_t ** pvJustis )
{
    Vec_Bit_t * vValues = Vec_BitStart( Gia_ManObjNum(p) * (pCex->iFrame + 1) );
    Vec_Bit_t * vJustis = Vec_BitStart( Gia_ManObjNum(p) * (pCex->iFrame + 1) );
    Gia_Obj_t * pObj;
    int i, k, iBit = 0, fCompl0, fCompl1, fJusti0, fJusti1, Shift;

    Gia_ManCleanMark0(p);
    Gia_ManCleanMark1(p);
    Gia_ManForEachRi( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    for ( Shift = i = 0; i <= pCex->iFrame; i++, Shift += Gia_ManObjNum(p) )
    {
        Gia_ManForEachObj( p, pObj, k )
        {
            if ( Gia_ObjIsAnd(pObj) )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                fJusti0 = Gia_ObjFanin0(pObj)->fMark1;
                fJusti1 = Gia_ObjFanin1(pObj)->fMark1;
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->fMark1 = fJusti0 & fJusti1;
                else if ( !fCompl0 && !fCompl1 )
                    pObj->fMark1 = fJusti0 | fJusti1;
                else if ( !fCompl0 )
                    pObj->fMark1 = fJusti0;
                else if ( !fCompl1 )
                    pObj->fMark1 = fJusti1;
                else assert( 0 );
            }
            else if ( Gia_ObjIsCi(pObj) )
            {
                if ( Gia_ObjIsPi(p, pObj) )
                {
                    pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
                    pObj->fMark1 = 1;
                }
                else
                {
                    pObj->fMark0 = Gia_ObjRoToRi(p, pObj)->fMark0;
                    pObj->fMark1 = Gia_ObjRoToRi(p, pObj)->fMark1;
                }
            }
            else if ( Gia_ObjIsCo(pObj) )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            }
            else if ( Gia_ObjIsConst0(pObj) )
                pObj->fMark1 = 1;
            else assert( 0 );
            if ( pObj->fMark0 )
                Vec_BitWriteEntry( vValues, Shift + k, 1 );
            if ( pObj->fMark1 )
                Vec_BitWriteEntry( vJustis, Shift + k, 1 );
        }
    }
    assert( iBit == pCex->nBits );
    Gia_ManCleanMark0(p);
    Gia_ManCleanMark1(p);
    // perform backward traversal to mark just nodes
    pObj = Gia_ManPo( p, pCex->iPo );
    assert( Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 0 );
//    Bmc_GiaGenerateJust_rec( p, pCex->iFrame, Gia_ObjId(p, pObj), vValues, vJustis );
    Vec_BitWriteEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj), 1);
    Bmc_GiaGenerateJustNonRec( p, pCex->iFrame, vValues, vJustis );
    assert( Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 1 );

    // return the result
    *pvValues = vValues;
    *pvJustis = vJustis;
}